

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O3

int gzungetc(int c,gzFile file)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined1 *puVar5;
  ulong uVar6;
  long lVar7;
  
  if (((file == (gzFile)0x0) || (*file != 0x1c4f)) || (*(int *)((long)file + 0x6c) != 0)) {
    return -1;
  }
  if (*(int *)((long)file + 0x68) == 0) {
    if (c < 0) {
      return -1;
    }
  }
  else {
    *(undefined4 *)((long)file + 0x68) = 0;
    iVar3 = gz_skip((gz_statep)file,*(long *)((long)file + 0x60));
    if (c < 0) {
      return -1;
    }
    if (iVar3 == -1) {
      return -1;
    }
  }
  uVar4 = *(uint *)((long)file + 0x38);
  if ((ulong)uVar4 == 0) {
    *(undefined4 *)((long)file + 0x38) = 1;
    puVar5 = (undefined1 *)
             (*(long *)((long)file + 0x28) + (ulong)(uint)(*(int *)((long)file + 0x18) * 2) + -1);
    *(undefined1 **)((long)file + 0x30) = puVar5;
    *puVar5 = (char)c;
  }
  else {
    uVar2 = *(int *)((long)file + 0x18) * 2;
    if (uVar4 == uVar2) {
      gz_error((gz_statep)file,-5,"out of room to push characters");
      return -1;
    }
    lVar1 = *(long *)((long)file + 0x28);
    lVar7 = *(long *)((long)file + 0x30);
    if (lVar7 == lVar1) {
      uVar6 = (ulong)uVar4 + lVar1;
      lVar7 = (ulong)uVar2 + lVar1;
      do {
        puVar5 = (undefined1 *)(uVar6 - 1);
        uVar6 = uVar6 - 1;
        *(undefined1 *)(lVar7 + -1) = *puVar5;
        lVar7 = lVar7 + -1;
      } while (*(ulong *)((long)file + 0x28) < uVar6);
      uVar4 = *(uint *)((long)file + 0x38);
    }
    *(uint *)((long)file + 0x38) = uVar4 + 1;
    *(long *)((long)file + 0x30) = lVar7 + -1;
    *(char *)(lVar7 + -1) = (char)c;
  }
  *(long *)((long)file + 0x10) = *(long *)((long)file + 0x10) + -1;
  return c;
}

Assistant:

int ZEXPORT gzungetc(int c, gzFile file)
{
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no error */
    if (state->mode != GZ_READ || state->err != Z_OK)
        return -1;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return -1;
    }

    /* can't push EOF */
    if (c < 0)
        return -1;

    /* if output buffer empty, put byte at end (allows more pushing) */
    if (state->have == 0) {
        state->have = 1;
        state->next = state->out + (state->size << 1) - 1;
        state->next[0] = c;
        state->pos--;
        return c;
    }

    /* if no room, give up (must have already done a gzungetc()) */
    if (state->have == (state->size << 1)) {
        gz_error(state, Z_BUF_ERROR, "out of room to push characters");
        return -1;
    }

    /* slide output data if needed and insert byte before existing data */
    if (state->next == state->out) {
        unsigned char *src = state->out + state->have;
        unsigned char *dest = state->out + (state->size << 1);
        while (src > state->out)
            *--dest = *--src;
        state->next = dest;
    }
    state->have++;
    state->next--;
    state->next[0] = c;
    state->pos--;
    return c;
}